

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::dump(Suffix_Array<unsigned_long> *this,ofstream *output)

{
  ostream *poVar1;
  char *in_RSI;
  anon_class_1_0_00000001 *in_RDI;
  rep_conflict rVar2;
  time_point t_end;
  size_t n;
  time_point t_start;
  nanoseconds *in_stack_ffffffffffffffb8;
  duration local_20;
  undefined8 local_18;
  char *local_10;
  
  local_10 = in_RSI;
  local_18 = std::chrono::_V2::system_clock::now();
  local_20.__r = *(rep *)(in_RDI + 8);
  std::ostream::write(local_10,(long)&local_20);
  std::ostream::write(local_10,(rep)*(duration *)(in_RDI + 0x10));
  std::ostream::write(local_10,(rep)*(duration *)(in_RDI + 0x18));
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,"Dumped the suffix array. Time taken: ");
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_RDI);
  rVar2 = anon_class_1_0_00000001::operator()(in_RDI,in_stack_ffffffffffffffb8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::dump(std::ofstream& output)
{
    const auto t_start = now();

    const std::size_t n = n_;
    output.write(reinterpret_cast<const char*>(&n), sizeof(std::size_t));
    output.write(reinterpret_cast<const char*>(SA_), n_ * sizeof(idx_t));
    output.write(reinterpret_cast<const char*>(LCP_), n_ * sizeof(idx_t));

    const auto t_end = now();
    std::cerr << "Dumped the suffix array. Time taken: " << duration(t_end - t_start) << " seconds.\n";
}